

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  TestPartResult *pTVar1;
  ostream *poVar2;
  int line;
  size_t in_RDX;
  size_t width;
  int iVar3;
  int iVar4;
  internal *piVar5;
  int local_dc;
  string kIndent;
  string location;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Indent_abi_cxx11_(&kIndent,(internal *)0xa,in_RDX);
  iVar4 = 0;
  iVar3 = 0;
  while( true ) {
    line = 0x70;
    if ((int)(((long)(result->test_part_results_).
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result->test_part_results_).
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= iVar4) break;
    pTVar1 = TestResult::GetTestPartResult(result,iVar4);
    if (pTVar1->type_ - kNonFatalFailure < 2) {
      std::operator<<(stream,",\n");
      if (iVar3 == 0) {
        poVar2 = std::operator<<(stream,(string *)&kIndent);
        poVar2 = std::operator<<(poVar2,"\"");
        poVar2 = std::operator<<(poVar2,"failures");
        std::operator<<(poVar2,"\": [\n");
      }
      piVar5 = (internal *)(pTVar1->file_name_)._M_string_length;
      if (piVar5 != (internal *)0x0) {
        piVar5 = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,piVar5,(char *)(ulong)(uint)pTVar1->line_number_,line);
      std::operator+(&local_70,&location,"\n");
      std::operator+(&local_50,&local_70,(pTVar1->message_)._M_dataplus._M_p);
      EscapeJson(&message,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      poVar2 = std::operator<<(stream,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"  {\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"    \"failure\": \"");
      poVar2 = std::operator<<(poVar2,(string *)&message);
      poVar2 = std::operator<<(poVar2,"\",\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"    \"type\": \"\"\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      std::operator<<(poVar2,"  }");
      iVar3 = iVar3 + 1;
      std::__cxx11::string::~string((string *)&message);
      std::__cxx11::string::~string((string *)&location);
    }
    iVar4 = iVar4 + 1;
  }
  if (0 < iVar3) {
    poVar2 = std::operator<<(stream,"\n");
    poVar2 = std::operator<<(poVar2,(string *)&kIndent);
    std::operator<<(poVar2,"]");
  }
  local_dc = 0;
  iVar3 = 0;
  while( true ) {
    iVar4 = 0x70;
    if ((int)(((long)(result->test_part_results_).
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result->test_part_results_).
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= iVar3) break;
    pTVar1 = TestResult::GetTestPartResult(result,iVar3);
    if (pTVar1->type_ == kSkip) {
      std::operator<<(stream,",\n");
      if (local_dc == 0) {
        poVar2 = std::operator<<(stream,(string *)&kIndent);
        poVar2 = std::operator<<(poVar2,"\"");
        poVar2 = std::operator<<(poVar2,"skipped");
        std::operator<<(poVar2,"\": [\n");
      }
      piVar5 = (internal *)(pTVar1->file_name_)._M_string_length;
      if (piVar5 != (internal *)0x0) {
        piVar5 = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,piVar5,(char *)(ulong)(uint)pTVar1->line_number_,iVar4);
      std::operator+(&local_70,&location,"\n");
      std::operator+(&local_50,&local_70,(pTVar1->message_)._M_dataplus._M_p);
      EscapeJson(&message,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      poVar2 = std::operator<<(stream,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"  {\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"    \"message\": \"");
      poVar2 = std::operator<<(poVar2,(string *)&message);
      poVar2 = std::operator<<(poVar2,"\"\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      std::operator<<(poVar2,"  }");
      local_dc = local_dc + 1;
      std::__cxx11::string::~string((string *)&message);
      std::__cxx11::string::~string((string *)&location);
    }
    iVar3 = iVar3 + 1;
  }
  if (0 < local_dc) {
    poVar2 = std::operator<<(stream,"\n");
    poVar2 = std::operator<<(poVar2,(string *)&kIndent);
    std::operator<<(poVar2,"]");
  }
  poVar2 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&location,(internal *)0x8,width);
  poVar2 = std::operator<<(poVar2,(string *)&location);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&kIndent);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  {
    int failures = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.failed()) {
        *stream << ",\n";
        if (++failures == 1) {
          *stream << kIndent << "\"" << "failures" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"failure\": \"" << message << "\",\n"
                << kIndent << "    \"type\": \"\"\n"
                << kIndent << "  }";
      }
    }

    if (failures > 0) *stream << "\n" << kIndent << "]";
  }

  {
    int skipped = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.skipped()) {
        *stream << ",\n";
        if (++skipped == 1) {
          *stream << kIndent << "\"" << "skipped" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"message\": \"" << message << "\"\n"
                << kIndent << "  }";
      }
    }

    if (skipped > 0) *stream << "\n" << kIndent << "]";
  }

  *stream << "\n" << Indent(8) << "}";
}